

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_extract.cpp
# Opt level: O0

void __thiscall ktx::CommandExtract::initOptions(CommandExtract *this,Options *opts)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  options;
  EVP_PKEY_CTX *in_RSI;
  long in_RDI;
  string *in_stack_fffffffffffffed8;
  Options *in_stack_fffffffffffffee0;
  allocator<char> *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  Options *this_02;
  iterator pbVar1;
  allocator<char> local_a1;
  string local_a0 [34];
  undefined1 local_7e;
  undefined1 local_7d [29];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  size_type local_18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_10;
  
  local_10._M_allocated_capacity = (size_type)in_RSI;
  Combine<ktx::CommandExtract::OptionsExtract,_ktx::OptionsTranscodeTarget<false>,_ktx::OptionsSingleIn,_ktx::OptionsGeneric>
  ::init((Combine<ktx::CommandExtract::OptionsExtract,_ktx::OptionsTranscodeTarget<false>,_ktx::OptionsSingleIn,_ktx::OptionsGeneric>
          *)(in_RDI + 0x48),in_RSI);
  local_7e = 1;
  local_7d._21_8_ = &local_60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  local_7d._21_8_ = local_40;
  pbVar1 = (iterator)local_7d;
  this_02 = (Options *)OptionsExtract::kOutput;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  local_7e = 0;
  local_20 = &local_60;
  local_18 = 2;
  options._M_len = local_10._M_allocated_capacity;
  options._M_array = pbVar1;
  cxxopts::Options::parse_positional(this_02,options);
  __s = &local_60;
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20;
  do {
    this_00 = this_00 + -1;
    std::__cxx11::string::~string((string *)this_00);
  } while (this_00 != __s);
  this_01 = this_00;
  std::allocator<char>::~allocator((allocator<char> *)local_7d);
  std::allocator<char>::~allocator((allocator<char> *)(local_7d + 0x14));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,(allocator<char> *)this_00)
  ;
  cxxopts::Options::positional_help(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  return;
}

Assistant:

void CommandExtract::initOptions(cxxopts::Options& opts) {
    options.init(opts);
    opts.parse_positional({"input-file", OptionsExtract::kOutput});
    opts.positional_help("<input-file> <output>");
}